

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O0

int json_pointer_getf(json_object *obj,json_object **res,char *path_fmt,...)

{
  char in_AL;
  int *piVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined4 local_58;
  undefined4 local_54;
  va_list args;
  int local_34;
  char *pcStack_30;
  int rc;
  char *path_copy;
  char *path_fmt_local;
  json_object **res_local;
  json_object *obj_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  pcStack_30 = (char *)0x0;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  path_copy = path_fmt;
  path_fmt_local = (char *)res;
  res_local = (json_object **)obj;
  if ((obj == (json_object *)0x0) || (path_fmt == (char *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    obj_local._4_4_ = -1;
  }
  else {
    args[0].overflow_arg_area = local_108;
    args[0]._0_8_ = &stack0x00000008;
    local_54 = 0x30;
    local_58 = 0x18;
    local_34 = vasprintf(&stack0xffffffffffffffd0,path_fmt,&local_58);
    obj_local._4_4_ = local_34;
    if (-1 < local_34) {
      if (*pcStack_30 == '\0') {
        if (path_fmt_local != (char *)0x0) {
          *(json_object ***)path_fmt_local = res_local;
        }
      }
      else {
        local_34 = json_pointer_object_get_recursive
                             ((json_object *)res_local,pcStack_30,(json_object **)path_fmt_local);
      }
      free(pcStack_30);
      obj_local._4_4_ = local_34;
    }
  }
  return obj_local._4_4_;
}

Assistant:

int json_pointer_getf(struct json_object *obj, struct json_object **res, const char *path_fmt, ...)
{
	char *path_copy = NULL;
	int rc = 0;
	va_list args;

	if (!obj || !path_fmt)
	{
		errno = EINVAL;
		return -1;
	}

	va_start(args, path_fmt);
	rc = vasprintf(&path_copy, path_fmt, args);
	va_end(args);

	if (rc < 0)
		return rc;

	if (path_copy[0] == '\0')
	{
		if (res)
			*res = obj;
		goto out;
	}

	rc = json_pointer_object_get_recursive(obj, path_copy, res);
out:
	free(path_copy);

	return rc;
}